

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall helics::ValueFederate::publishJSON(ValueFederate *this,string *jsonString)

{
  pointer ppVar1;
  pointer ppVar2;
  Publication *this_00;
  variant_alternative_t<1UL,_variant<double,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *val;
  variant_alternative_t<0UL,_variant<double,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *pvVar3;
  variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  string_view name;
  allocator<char> local_69;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vpairs;
  json json;
  string local_40;
  
  fileops::loadJson((fileops *)&json,jsonString);
  vpairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vpairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vpairs.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_69);
  generateData(&vpairs,&local_40,
               (char)(this->_vptr_ValueFederate[-3] + 1)[(long)&(this->vfManager)._M_t],&json);
  std::__cxx11::string::~string((string *)&local_40);
  ppVar2 = vpairs.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = vpairs.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (__v = (variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)ppVar1 + 0x20),
        ppVar1 = (pointer)((long)&__v[-1].
                                  super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  .
                                  super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>
                                  .
                                  super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>
                                  .super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_>
                                  .super__Copy_ctor_alias<double,_std::__cxx11::basic_string<char>_>
                                  .
                                  super__Variant_storage_alias<double,_std::__cxx11::basic_string<char>_>
                                  ._M_u + 8), ppVar1 != ppVar2) {
    name._M_str = (ppVar1->first)._M_dataplus._M_p;
    name._M_len = *(size_t *)
                   ((long)&__v[-1].
                           super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
                           super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
                           super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_>.
                           super__Copy_ctor_alias<double,_std::__cxx11::basic_string<char>_>.
                           super__Variant_storage_alias<double,_std::__cxx11::basic_string<char>_>.
                           _M_u + 0x10);
    this_00 = getPublication(this,name);
    if ((this_00->super_Interface).handle.hid != -1700000000) {
      if ((__v->
          super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
          super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
          super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_>.
          super__Copy_ctor_alias<double,_std::__cxx11::basic_string<char>_>.
          super__Variant_storage_alias<double,_std::__cxx11::basic_string<char>_>._M_index == '\0')
      {
        pvVar3 = std::get<0ul,double,std::__cxx11::string>(__v);
        Publication::publish(this_00,*pvVar3);
      }
      else {
        val = std::get<1ul,double,std::__cxx11::string>(__v);
        Publication::publish<std::__cxx11::string>(this_00,val);
      }
    }
    ppVar1 = (pointer)&__v[1].
                       super__Variant_base<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .super__Move_assign_alias<double,_std::__cxx11::basic_string<char>_>.
                       super__Copy_assign_alias<double,_std::__cxx11::basic_string<char>_>.
                       super__Move_ctor_alias<double,_std::__cxx11::basic_string<char>_>.
                       super__Copy_ctor_alias<double,_std::__cxx11::basic_string<char>_>.
                       super__Variant_storage_alias<double,_std::__cxx11::basic_string<char>_>;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::variant<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&vpairs);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&json.m_data);
  return;
}

Assistant:

void ValueFederate::publishJSON(const std::string& jsonString)
{
    auto json = [&]() {
        try {
            return fileops::loadJson(jsonString);
        }
        catch (const std::invalid_argument&) {
            throw(helics::InvalidParameter("unable to load file or string"));
        }
    }();
    std::vector<std::pair<std::string, dvalue>> vpairs;
    generateData(vpairs, "", nameSegmentSeparator, json);

    for (auto& value : vpairs) {
        auto& pub = getPublication(value.first);
        if (pub.isValid()) {
            if (value.second.index() == 0) {
                pub.publish(std::get<double>(value.second));
            } else {
                pub.publish(std::get<std::string>(value.second));
            }
        }
    }
}